

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O2

Element QCborContainerPrivate::elementFromValue(QCborValue *value)

{
  undefined4 uVar1;
  anon_union_8_2_4ee71171_for_Element_0 aVar2;
  Element *pEVar3;
  undefined4 uVar4;
  Element *pEVar5;
  anon_union_8_2_4ee71171_for_Element_0 aVar6;
  ulong uVar7;
  Element EVar8;
  Element EVar9;
  Element EVar10;
  
  aVar6 = (anon_union_8_2_4ee71171_for_Element_0)value->n;
  aVar2 = (anon_union_8_2_4ee71171_for_Element_0)value->container;
  if (aVar6.value < 0) {
    uVar7 = (ulong)(uint)value->t;
    if ((QCborContainerPrivate *)aVar2.value != (QCborContainerPrivate *)0x0) {
      uVar7 = uVar7 | 0x100000000;
      aVar6 = aVar2;
    }
    EVar9.type = (int)uVar7;
    EVar9.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
         (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)(int)(uVar7 >> 0x20);
    EVar9.field_0.value = aVar6.value;
    return EVar9;
  }
  if ((QCborContainerPrivate *)aVar2.value != (QCborContainerPrivate *)0x0) {
    pEVar3 = ((aVar2.container)->elements).d.ptr;
    pEVar5 = pEVar3 + aVar6.value;
    uVar1 = pEVar5->type;
    uVar4 = pEVar5->flags;
    EVar8.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
         (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)uVar4;
    EVar8.type = uVar1;
    EVar8.field_0.value = pEVar3[aVar6.value].field_0.value;
    return EVar8;
  }
  EVar10.type = value->t;
  EVar10.field_0.value = aVar6.value;
  EVar10.flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
  super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
       (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)0x0;
  return EVar10;
}

Assistant:

static QtCbor::Element elementFromValue(const QCborValue &value)
    {
        if (value.n >= 0 && value.container)
            return value.container->elements.at(value.n);

        QtCbor::Element e;
        e.value = value.n;
        e.type = value.t;
        if (value.container) {
            e.container = value.container;
            e.flags = QtCbor::Element::IsContainer;
        }
        return e;
    }